

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall
ImGuiInputTextCallbackData::DeleteChars(ImGuiInputTextCallbackData *this,int pos,int bytes_count)

{
  char *pcStack_28;
  char c;
  char *src;
  char *dst;
  int bytes_count_local;
  int pos_local;
  ImGuiInputTextCallbackData *this_local;
  
  if (this->BufTextLen < pos + bytes_count) {
    __assert_fail("pos + bytes_count <= BufTextLen",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                  ,0xc4c,"void ImGuiInputTextCallbackData::DeleteChars(int, int)");
  }
  pcStack_28 = this->Buf + (long)bytes_count + (long)pos;
  src = this->Buf + pos;
  while( true ) {
    if (*pcStack_28 == '\0') break;
    *src = *pcStack_28;
    pcStack_28 = pcStack_28 + 1;
    src = src + 1;
  }
  *src = '\0';
  if (this->CursorPos + bytes_count < pos) {
    if (pos <= this->CursorPos) {
      this->CursorPos = pos;
    }
  }
  else {
    this->CursorPos = this->CursorPos - bytes_count;
  }
  this->SelectionEnd = this->CursorPos;
  this->SelectionStart = this->CursorPos;
  this->BufDirty = true;
  this->BufTextLen = this->BufTextLen - bytes_count;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::DeleteChars(int pos, int bytes_count)
{
    IM_ASSERT(pos + bytes_count <= BufTextLen);
    char* dst = Buf + pos;
    const char* src = Buf + pos + bytes_count;
    while (char c = *src++)
        *dst++ = c;
    *dst = '\0';

    if (CursorPos + bytes_count >= pos)
        CursorPos -= bytes_count;
    else if (CursorPos >= pos)
        CursorPos = pos;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen -= bytes_count;
}